

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  OneofDescriptor *this_00;
  long lVar1;
  Type TVar2;
  size_type sVar3;
  FieldDescriptor *this_01;
  int i_2;
  int i_7;
  int iVar4;
  undefined4 in_register_00000034;
  long lVar5;
  int i_4;
  long lVar6;
  int i;
  long lVar7;
  long lVar8;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  string prefix;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  undefined8 local_150;
  SubstituteArg local_148;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  string local_e8;
  SourceLocationCommentPrinter comment_printer;
  
  local_150 = CONCAT44(in_register_00000034,depth);
  if (*(char *)(*(long *)(this + 0x20) + 0x6b) == '\0') {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      groups._M_t._M_impl._0_8_ = prefix._M_dataplus._M_p;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)prefix._M_string_length;
      local_1e0.text_ = (char *)**(undefined8 **)this;
      local_1e0.size_ = *(int *)(*(undefined8 **)this + 1);
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_268.text_ = (char *)0x0;
      local_268.size_ = -1;
      local_298.text_ = (char *)0x0;
      local_298.size_ = -1;
      local_2c8.text_ = (char *)0x0;
      local_2c8.size_ = -1;
      local_2f8.text_ = (char *)0x0;
      local_2f8.size_ = -1;
      local_328.text_ = (char *)0x0;
      local_328.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0message $1",(SubstituteArg *)&groups,&local_1e0,&local_148,&local_180,
                 &local_1b0,&local_268,&local_298,&local_2c8,&local_2f8,&local_328);
    }
    std::__cxx11::string::append((char *)contents);
    iVar4 = (int)local_150 + 1;
    anon_unknown_1::FormatLineOptions
              (iVar4,*(Message **)(this + 0x20),*(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),
               contents);
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &groups._M_t._M_impl.super__Rb_tree_header._M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar6 = 0;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar7 = 0; lVar7 < *(int *)(this + 0x2c); lVar7 = lVar7 + 1) {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(this + 0x30) + lVar6));
      if (TVar2 == TYPE_GROUP) {
        local_1e0.text_ =
             (char *)FieldDescriptor::message_type
                               ((FieldDescriptor *)(*(long *)(this + 0x30) + lVar6));
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_1e0);
      }
      lVar6 = lVar6 + 0xa8;
    }
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(this + 0x78); lVar7 = lVar7 + 1) {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(this + 0x80) + lVar6));
      if (TVar2 == TYPE_GROUP) {
        local_1e0.text_ =
             (char *)FieldDescriptor::message_type
                               ((FieldDescriptor *)(*(long *)(this + 0x80) + lVar6));
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_1e0);
      }
      lVar6 = lVar6 + 0xa8;
    }
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(this + 0x48); lVar6 = lVar6 + 1) {
      local_1e0.text_ = (char *)(*(long *)(this + 0x50) + lVar7);
      sVar3 = std::
              set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::count(&groups,(key_type *)&local_1e0);
      if (sVar3 == 0) {
        DebugString((Descriptor *)(*(long *)(this + 0x50) + lVar7),iVar4,contents,
                    debug_string_options,true);
      }
      lVar7 = lVar7 + 0xa8;
    }
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(this + 0x58); lVar7 = lVar7 + 1) {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x60) + lVar6),iVar4,contents,
                 debug_string_options);
      lVar6 = lVar6 + 0x38;
    }
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(this + 0x2c); lVar6 = lVar6 + 1) {
      this_00 = *(OneofDescriptor **)(*(long *)(this + 0x30) + 0x60 + lVar7);
      this_01 = (FieldDescriptor *)(*(long *)(this + 0x30) + lVar7);
      if (this_00 == (OneofDescriptor *)0x0) {
        FieldDescriptor::DebugString(this_01,iVar4,PRINT_LABEL,contents,debug_string_options);
      }
      else if (this_01 == (FieldDescriptor *)**(long **)(this_00 + 0x20)) {
        OneofDescriptor::DebugString(this_00,iVar4,contents,debug_string_options);
      }
      lVar7 = lVar7 + 0xa8;
    }
    for (lVar6 = 0; lVar6 < *(int *)(this + 0x68); lVar6 = lVar6 + 1) {
      local_1e0.text_ = prefix._M_dataplus._M_p;
      local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
      strings::internal::SubstituteArg::SubstituteArg
                (&local_148,*(int *)(*(long *)(this + 0x70) + lVar6 * 8));
      strings::internal::SubstituteArg::SubstituteArg
                (&local_180,*(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 8) + -1);
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_268.text_ = (char *)0x0;
      local_268.size_ = -1;
      local_298.text_ = (char *)0x0;
      local_298.size_ = -1;
      local_2c8.text_ = (char *)0x0;
      local_2c8.size_ = -1;
      local_2f8.text_ = (char *)0x0;
      local_2f8.size_ = -1;
      local_328.text_ = (char *)0x0;
      local_328.size_ = -1;
      local_238.text_ = (char *)0x0;
      local_238.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  extensions $1 to $2;\n",&local_1e0,&local_148,&local_180,&local_1b0,
                 &local_268,&local_298,&local_2c8,&local_2f8,&local_328,&local_238);
    }
    iVar4 = (int)local_150;
    lVar8 = 0;
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(this + 0x78); lVar7 = lVar7 + 1) {
      lVar5 = *(long *)(this + 0x80);
      lVar1 = *(long *)(lVar5 + 0x58 + lVar8);
      if (lVar1 != lVar6) {
        lVar6 = lVar1;
        if (lVar8 != 0) {
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          local_268.text_ = (char *)0x0;
          local_268.size_ = -1;
          local_298.text_ = (char *)0x0;
          local_298.size_ = -1;
          local_2c8.text_ = (char *)0x0;
          local_2c8.size_ = -1;
          local_2f8.text_ = (char *)0x0;
          local_2f8.size_ = -1;
          local_328.text_ = (char *)0x0;
          local_1e0.text_ = prefix._M_dataplus._M_p;
          local_328.size_ = -1;
          local_238.text_ = (char *)0x0;
          local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
          local_238.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  }\n",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                     &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
          lVar6 = *(long *)(*(long *)(this + 0x80) + 0x58 + lVar8);
        }
        local_1e0.text_ = prefix._M_dataplus._M_p;
        local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_148.text_ = (char *)**(undefined8 **)(lVar6 + 8);
        local_148.size_ = *(int *)(*(undefined8 **)(lVar6 + 8) + 1);
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_268.text_ = (char *)0x0;
        local_268.size_ = -1;
        local_298.text_ = (char *)0x0;
        local_298.size_ = -1;
        local_2c8.text_ = (char *)0x0;
        local_2c8.size_ = -1;
        local_2f8.text_ = (char *)0x0;
        local_2f8.size_ = -1;
        local_328.text_ = (char *)0x0;
        local_328.size_ = -1;
        local_238.text_ = (char *)0x0;
        local_238.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extend .$1 {\n",&local_1e0,&local_148,&local_180,&local_1b0,
                   &local_268,&local_298,&local_2c8,&local_2f8,&local_328,&local_238);
        lVar5 = *(long *)(this + 0x80);
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(lVar5 + lVar8),iVar4 + 2,PRINT_LABEL,contents,
                 debug_string_options);
      lVar8 = lVar8 + 0xa8;
    }
    if (0 < *(int *)(this + 0x78)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_268.text_ = (char *)0x0;
      local_268.size_ = -1;
      local_298.text_ = (char *)0x0;
      local_298.size_ = -1;
      local_2c8.text_ = (char *)0x0;
      local_2c8.size_ = -1;
      local_2f8.text_ = (char *)0x0;
      local_2f8.size_ = -1;
      local_328.text_ = (char *)0x0;
      local_1e0.text_ = prefix._M_dataplus._M_p;
      local_328.size_ = -1;
      local_238.text_ = (char *)0x0;
      local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_238.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  }\n",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                 &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
    }
    if (0 < *(int *)(this + 0x88)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_268.text_ = (char *)0x0;
      local_268.size_ = -1;
      local_298.text_ = (char *)0x0;
      local_298.size_ = -1;
      local_2c8.text_ = (char *)0x0;
      local_2c8.size_ = -1;
      local_2f8.text_ = (char *)0x0;
      local_2f8.size_ = -1;
      local_328.text_ = (char *)0x0;
      local_1e0.text_ = prefix._M_dataplus._M_p;
      local_328.size_ = -1;
      local_238.text_ = (char *)0x0;
      local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_238.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                 &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
      for (lVar6 = 0; lVar6 < *(int *)(this + 0x88); lVar6 = lVar6 + 1) {
        lVar7 = *(long *)(this + 0x90);
        iVar4 = *(int *)(lVar7 + lVar6 * 8);
        if (*(int *)(lVar7 + 4 + lVar6 * 8) == iVar4 + 1) {
          strings::internal::SubstituteArg::SubstituteArg(&local_1e0,iVar4);
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          local_268.text_ = (char *)0x0;
          local_268.size_ = -1;
          local_298.text_ = (char *)0x0;
          local_298.size_ = -1;
          local_2c8.text_ = (char *)0x0;
          local_2c8.size_ = -1;
          local_2f8.text_ = (char *)0x0;
          local_2f8.size_ = -1;
          local_328.text_ = (char *)0x0;
          local_328.size_ = -1;
          local_238.text_ = (char *)0x0;
          local_238.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0, ",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                     &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
        }
        else {
          strings::internal::SubstituteArg::SubstituteArg(&local_1e0,iVar4);
          strings::internal::SubstituteArg::SubstituteArg
                    (&local_148,*(int *)(lVar7 + 4 + lVar6 * 8) + -1);
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          local_268.text_ = (char *)0x0;
          local_268.size_ = -1;
          local_298.text_ = (char *)0x0;
          local_298.size_ = -1;
          local_2c8.text_ = (char *)0x0;
          local_2c8.size_ = -1;
          local_2f8.text_ = (char *)0x0;
          local_2f8.size_ = -1;
          local_328.text_ = (char *)0x0;
          local_328.size_ = -1;
          local_238.text_ = (char *)0x0;
          local_238.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0 to $1, ",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                     &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
        }
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    if (0 < *(int *)(this + 0x98)) {
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_268.text_ = (char *)0x0;
      local_268.size_ = -1;
      local_298.text_ = (char *)0x0;
      local_298.size_ = -1;
      local_2c8.text_ = (char *)0x0;
      local_2c8.size_ = -1;
      local_2f8.text_ = (char *)0x0;
      local_2f8.size_ = -1;
      local_328.text_ = (char *)0x0;
      local_1e0.text_ = prefix._M_dataplus._M_p;
      local_328.size_ = -1;
      local_238.text_ = (char *)0x0;
      local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_238.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                 &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
      for (lVar6 = 0; lVar6 < *(int *)(this + 0x98); lVar6 = lVar6 + 1) {
        CEscape(&local_e8,*(string **)(*(long *)(this + 0xa0) + lVar6 * 8));
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_268.text_ = (char *)0x0;
        local_268.size_ = -1;
        local_298.text_ = (char *)0x0;
        local_298.size_ = -1;
        local_2c8.text_ = (char *)0x0;
        local_2c8.size_ = -1;
        local_2f8.text_ = (char *)0x0;
        local_2f8.size_ = -1;
        local_328.text_ = (char *)0x0;
        local_1e0.text_ = local_e8._M_dataplus._M_p;
        local_328.size_ = -1;
        local_238.text_ = (char *)0x0;
        local_1e0.size_ = (_Rb_tree_color)local_e8._M_string_length;
        local_238.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"\"$0\", ",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,
                   &local_298,&local_2c8,&local_2f8,&local_328,&local_238);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_268.text_ = (char *)0x0;
    local_268.size_ = -1;
    local_298.text_ = (char *)0x0;
    local_298.size_ = -1;
    local_2c8.text_ = (char *)0x0;
    local_2c8.size_ = -1;
    local_2f8.text_ = (char *)0x0;
    local_2f8.size_ = -1;
    local_328.text_ = (char *)0x0;
    local_1e0.text_ = prefix._M_dataplus._M_p;
    local_328.size_ = -1;
    local_238.text_ = (char *)0x0;
    local_1e0.size_ = (_Rb_tree_color)prefix._M_string_length;
    local_238.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_1e0,&local_148,&local_180,&local_1b0,&local_268,&local_298,
               &local_2c8,&local_2f8,&local_328,&local_238);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    std::
    _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Rb_tree(&groups._M_t);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
    std::__cxx11::string::~string((string *)&prefix);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, string *contents,
                             const DebugStringOptions&
                             debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->containing_oneof() == NULL) {
      field(i)->DebugString(depth, FieldDescriptor::PRINT_LABEL, contents,
                            debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n",
                                 prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n",
                                   prefix, containing_type->full_name());
    }
    extension(i)->DebugString(
        depth + 1, FieldDescriptor::PRINT_LABEL, contents,
        debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ",
                                     range->start, range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                   CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}